

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O1

void remove_recolour(opr_rbtree *head,opr_rbtree_node *parent,opr_rbtree_node *node)

{
  opr_rbtree_node *poVar1;
  opr_rbtree_node *poVar2;
  opr_rbtree_node *left;
  opr_rbtree_node *poVar3;
  opr_rbtree_node *right;
  opr_rbtree *poVar4;
  
  do {
    if (((node != (opr_rbtree_node *)0x0) && (node->red != 0)) || (node == head->root))
    goto LAB_00110764;
    poVar3 = parent->left;
    if (poVar3 == node) {
      poVar3 = parent->right;
      if (poVar3->red != 0) {
        poVar3->red = 0;
        parent->red = 1;
        poVar1 = poVar3->left;
        parent->right = poVar1;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar1->parent = parent;
        }
        poVar3->left = parent;
        poVar3->parent = parent->parent;
        poVar1 = parent->parent;
        poVar4 = head;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar4 = (opr_rbtree *)(&poVar1->left + (poVar1->left != parent));
        }
        poVar4->root = poVar3;
        parent->parent = poVar3;
        poVar3 = parent->right;
      }
      poVar1 = poVar3->left;
      if (((poVar1 != (opr_rbtree_node *)0x0) && (poVar1->red != 0)) ||
         ((poVar3->right != (opr_rbtree_node *)0x0 && (poVar3->right->red != 0)))) {
        if ((poVar3->right == (opr_rbtree_node *)0x0) || (poVar3->right->red == 0)) {
          poVar1->red = 0;
          poVar3->red = 1;
          poVar2 = poVar1->right;
          poVar3->left = poVar2;
          if (poVar2 != (opr_rbtree_node *)0x0) {
            poVar2->parent = poVar3;
          }
          poVar1->right = poVar3;
          poVar1->parent = poVar3->parent;
          poVar2 = poVar3->parent;
          poVar4 = head;
          if (poVar2 != (opr_rbtree_node *)0x0) {
            poVar4 = (opr_rbtree *)(&poVar2->left + (poVar2->left != poVar3));
          }
          poVar4->root = poVar1;
          poVar3->parent = poVar1;
          poVar3 = parent->right;
        }
        poVar3->red = parent->red;
        parent->red = 0;
        poVar3->right->red = 0;
        poVar3 = parent->right;
        poVar1 = poVar3->left;
        parent->right = poVar1;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar1->parent = parent;
        }
        poVar3->left = parent;
        goto LAB_00110739;
      }
    }
    else {
      if (poVar3->red != 0) {
        poVar3->red = 0;
        parent->red = 1;
        poVar1 = poVar3->right;
        parent->left = poVar1;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar1->parent = parent;
        }
        poVar3->right = parent;
        poVar3->parent = parent->parent;
        poVar1 = parent->parent;
        poVar4 = head;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar4 = (opr_rbtree *)(&poVar1->left + (poVar1->left != parent));
        }
        poVar4->root = poVar3;
        parent->parent = poVar3;
        poVar3 = parent->left;
      }
      poVar1 = poVar3->left;
      if (((poVar1 != (opr_rbtree_node *)0x0) && (poVar1->red != 0)) ||
         ((poVar3->right != (opr_rbtree_node *)0x0 && (poVar3->right->red != 0)))) {
        if ((poVar1 == (opr_rbtree_node *)0x0) || (poVar1->red == 0)) {
          poVar1 = poVar3->right;
          poVar1->red = 0;
          poVar3->red = 1;
          poVar2 = poVar1->left;
          poVar3->right = poVar2;
          if (poVar2 != (opr_rbtree_node *)0x0) {
            poVar2->parent = poVar3;
          }
          poVar1->left = poVar3;
          poVar1->parent = poVar3->parent;
          poVar2 = poVar3->parent;
          poVar4 = head;
          if (poVar2 != (opr_rbtree_node *)0x0) {
            poVar4 = (opr_rbtree *)(&poVar2->left + (poVar2->left != poVar3));
          }
          poVar4->root = poVar1;
          poVar3->parent = poVar1;
          poVar3 = parent->left;
        }
        poVar3->red = parent->red;
        parent->red = 0;
        poVar3->left->red = 0;
        poVar3 = parent->left;
        poVar1 = poVar3->right;
        parent->left = poVar1;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar1->parent = parent;
        }
        poVar3->right = parent;
LAB_00110739:
        poVar3->parent = parent->parent;
        poVar1 = parent->parent;
        poVar4 = head;
        if (poVar1 != (opr_rbtree_node *)0x0) {
          poVar4 = (opr_rbtree *)(&poVar1->left + (poVar1->left != parent));
        }
        poVar4->root = poVar3;
        parent->parent = poVar3;
        node = head->root;
LAB_00110764:
        if (node != (opr_rbtree_node *)0x0) {
          node->red = 0;
        }
        return;
      }
    }
    poVar3->red = 1;
    node = parent;
    parent = parent->parent;
  } while( true );
}

Assistant:

static void remove_recolour(struct opr_rbtree *head,
			    struct opr_rbtree_node *parent,
			    struct opr_rbtree_node *node)
{
	struct opr_rbtree_node *other;

	while ((node == NULL || !node->red) && node != head->root) {
		if (parent->left == node) {
			other = parent->right;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateleft(head, parent);
				other = parent->right;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if ((other->right == NULL) ||
				    (!other->right->red)) {
					other->left->red = 0;
					other->red = 1;
					rotateright(head, other);
					other = parent->right;
				}
				other->red = parent->red;
				parent->red = 0;
				other->right->red = 0;
				rotateleft(head, parent);
				node = head->root;
				break;
			}
		} else {
			other = parent->left;
			if (other->red) {
				other->red = 0;
				parent->red = 1;
				rotateright(head, parent);
				other = parent->left;
			}
			if ((other->left == NULL || !other->left->red)
			    && (other->right == NULL || !other->right->red)) {
				other->red = 1;
				node = parent;
				parent = node->parent;
			} else {
				if (other->left == NULL || !other->left->red) {
					other->right->red = 0;
					other->red = 1;
					rotateleft(head, other);
					other = parent->left;
				}
				other->red = parent->red;
				parent->red = 0;
				other->left->red = 0;
				rotateright(head, parent);
				node = head->root;
				break;
			}
		}
	}
	if (node)
		node->red = 0;
}